

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O1

int __thiscall CPU::instrROR0x76(CPU *this)

{
  byte bVar1;
  uint16_t addr;
  Memory *this_00;
  uint8_t uVar2;
  byte bVar3;
  byte bVar4;
  byte value;
  
  addr = this->PC;
  this->PC = addr + 1;
  uVar2 = Memory::Read8(this->m,addr);
  bVar3 = uVar2 + this->X;
  this_00 = this->m;
  bVar4 = Memory::Read8(this_00,(ushort)bVar3);
  bVar1 = this->field_0x2e;
  value = bVar1 & 0x80 | bVar4 >> 1;
  this->field_0x2e = bVar1 >> 7 | bVar4 << 7 | bVar1 & 0x3e | (value == 0) << 6;
  Memory::Write8(this_00,(ushort)bVar3,value);
  return 6;
}

Assistant:

int CPU::instrROR0x76() {
	uint16_t address = zeropage_x_addr_j();
	m->Write8(address, ROR(m->Read8(address)));
	return 6;
}